

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

float ncnn::bfloat16_to_float32(unsigned_short value)

{
  anon_union_4_2_947300b0 tmp;
  unsigned_short value_local;
  
  return (float)((uint)value << 0x10);
}

Assistant:

NCNN_EXPORT inline float bfloat16_to_float32(unsigned short value)
{
    // 16 : 16
    union
    {
        unsigned int u;
        float f;
    } tmp;
    tmp.u = value << 16;
    return tmp.f;
}